

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

Index __thiscall
BayesianGameCollaborativeGraphical::JointToGroupTypeIndex
          (BayesianGameCollaborativeGraphical *this,Index e,Index jtI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  indivIndices = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this,jtI);
  RestrictIndividualIndicesToScope<unsigned_int>(&local_30,this,indivIndices,e);
  IVar1 = IndexTools::IndividualToJointIndicesStepSize
                    (&local_30,
                     ((this->_m_LRFs).
                      super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[e]->
                     super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                     _m_stepSizeTypes);
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar1;
}

Assistant:

Index  BayesianGameCollaborativeGraphical::
JointToGroupTypeIndex(Index e, Index jtI) const
{
    const vector<Index> &indTypes = JointToIndividualTypeIndices(jtI);
    vector<Index> restrictedIndivTypes = RestrictIndividualIndicesToScope(
            indTypes, e);    
    Index jtGI = _m_LRFs[e]->
        IndividualToJointTypeIndices(restrictedIndivTypes);
    return(jtGI);
}